

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindFirst<true,false>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference this_00;
  pointer pEVar2;
  InternalException *this_01;
  LogicalType *type;
  type name;
  LogicalType input_type;
  size_type *local_1b8;
  size_type local_1b0;
  size_type local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  LogicalType local_198;
  string local_180;
  AggregateFunction local_160;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&local_198,&pEVar2->return_type);
  local_1b8 = (size_type *)
              (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
  paVar1 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 == paVar1) {
    local_1a8 = paVar1->_M_allocated_capacity;
    uStack_1a0 = *(undefined4 *)
                  ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                          name.field_2 + 8);
    uStack_19c = *(undefined4 *)
                  ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                          name.field_2 + 0xc);
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = paVar1->_M_allocated_capacity;
  }
  local_1b0 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
              _M_string_length;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)paVar1;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_string_length = 0
  ;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2._M_local_buf
  [0] = '\0';
  if (local_198.id_ != DECIMAL) {
    GetFirstFunction<true,false>(&local_160,(duckdb *)&local_198,type);
    AggregateFunction::operator=(function,&local_160);
    local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_01996688;
    if (local_160.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.function_info.internal.
                 super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
    ::std::__cxx11::string::operator=
              ((string *)
               &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,
               (string *)&local_1b8);
    function->distinct_dependent = NOT_DISTINCT_DEPENDENT;
    if (function->bind == (bind_aggregate_function_t)0x0) {
      *(undefined8 *)this = 0;
    }
    else {
      (*function->bind)((ClientContext *)this,(AggregateFunction *)context,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)function);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8);
    }
    LogicalType::~LogicalType(&local_198);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"FIXME: this shouldn\'t happen...","");
  InternalException::InternalException(this_01,&local_180);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindFirst(ClientContext &context, AggregateFunction &function,
                                   vector<unique_ptr<Expression>> &arguments) {
	auto input_type = arguments[0]->return_type;
	auto name = std::move(function.name);
	function = GetFirstOperator<LAST, SKIP_NULLS>(input_type);
	function.name = std::move(name);
	function.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	if (function.bind) {
		return function.bind(context, function, arguments);
	} else {
		return nullptr;
	}
}